

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_string<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  location<std::vector<char,_std::allocator<char>_>_> *plVar1;
  char cVar2;
  location<std::vector<char,_std::allocator<char>_>_> *plVar3;
  location<std::vector<char,_std::allocator<char>_>_> *plVar4;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_e2;
  allocator<char> local_e1;
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  location<std::vector<char,_std::allocator<char>_>_> *local_a8;
  string local_a0;
  string local_80;
  char *local_60;
  size_type local_58;
  char local_50 [8];
  undefined8 uStack_48;
  undefined1 local_40 [40];
  
  plVar4 = *(location<std::vector<char,_std::allocator<char>_>_> **)(this + 0x40);
  plVar3 = *(location<std::vector<char,_std::allocator<char>_>_> **)(*(long *)(this + 8) + 8);
  if (plVar4 != plVar3) {
    cVar2 = *(char *)&(plVar4->super_region_base)._vptr_region_base;
    if (cVar2 == '\'') {
      plVar1 = (location<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&(plVar4->super_region_base)._vptr_region_base + 1);
      if ((((plVar1 != plVar3) && (*(char *)&(plVar1->super_region_base)._vptr_region_base == '\''))
          && (plVar4 = (location<std::vector<char,_std::allocator<char>_>_> *)
                       ((long)&(plVar4->super_region_base)._vptr_region_base + 2), plVar4 != plVar3)
          ) && (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\'')) {
        parse_ml_literal_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,this,plVar1);
        return __return_storage_ptr__;
      }
      parse_literal_string<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,this,plVar1);
      return __return_storage_ptr__;
    }
    if (cVar2 == '\"') {
      plVar1 = (location<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&(plVar4->super_region_base)._vptr_region_base + 1);
      if (((plVar1 != plVar3) && (*(char *)&(plVar1->super_region_base)._vptr_region_base == '\"'))
         && ((plVar4 = (location<std::vector<char,_std::allocator<char>_>_> *)
                       ((long)&(plVar4->super_region_base)._vptr_region_base + 2), plVar4 != plVar3
             && (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\"')))) {
        parse_ml_basic_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,this,plVar1);
        return __return_storage_ptr__;
      }
      parse_basic_string<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,plVar1)
      ;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"[error] toml::parse_string: ",&local_e1);
  local_a8 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
  std::
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[31],_true>
            ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,&local_a8,(char (*) [31])0x133d8e);
  __l._M_len = 1;
  __l._M_array = (iterator)local_40;
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_e0,__l,&local_e2);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_underline(&local_80,&local_a0,&local_e0,&local_c8);
  local_60 = local_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    uStack_48 = local_80.field_2._8_8_;
  }
  else {
    local_60 = local_80._M_dataplus._M_p;
  }
  local_58 = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(failure_type *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_e0);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<toml::string, region<Container>>, std::string>
parse_string(location<Container>& loc)
{
    if(loc.iter() != loc.end() && *(loc.iter()) == '"')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '"' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '"')
        {
            return parse_ml_basic_string(loc);
        }
        else
        {
            return parse_basic_string(loc);
        }
    }
    else if(loc.iter() != loc.end() && *(loc.iter()) == '\'')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '\'' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '\'')
        {
            return parse_ml_literal_string(loc);
        }
        else
        {
            return parse_literal_string(loc);
        }
    }
    return err(format_underline("[error] toml::parse_string: ",
                {{std::addressof(loc), "the next token is not a string"}}));
}